

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1555.c
# Opt level: O0

int progressCallback(void *arg,double dltotal,double dlnow,double ultotal,double ulnow)

{
  undefined8 local_140;
  size_t n;
  char buffer [256];
  CURLcode res;
  double ulnow_local;
  double ultotal_local;
  double dlnow_local;
  double dltotal_local;
  void *arg_local;
  
  buffer[0xfc] = '\0';
  buffer[0xfd] = '\0';
  buffer[0xfe] = '\0';
  buffer[0xff] = '\0';
  local_140 = 0;
  buffer._252_4_ = curl_easy_recv(curl,&n,0x100,&local_140);
  curl_mprintf("curl_easy_recv returned %d\n",buffer._252_4_);
  buffer._252_4_ = curl_easy_send(curl,&n,local_140,&local_140);
  curl_mprintf("curl_easy_send returned %d\n",buffer._252_4_);
  return 1;
}

Assistant:

static int progressCallback(void *arg,
                            double dltotal,
                            double dlnow,
                            double ultotal,
                            double ulnow)
{
  CURLcode res = 0;
  char buffer[256];
  size_t n = 0;
  (void)arg;
  (void)dltotal;
  (void)dlnow;
  (void)ultotal;
  (void)ulnow;
  res = curl_easy_recv(curl, buffer, 256, &n);
  printf("curl_easy_recv returned %d\n", res);
  res = curl_easy_send(curl, buffer, n, &n);
  printf("curl_easy_send returned %d\n", res);

  return 1;
}